

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O1

int pmain(lua_State *L)

{
  char cVar1;
  byte bVar2;
  Instruction *pIVar3;
  LocVar *pLVar4;
  Upvaldesc *pUVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  lua_Integer lVar11;
  void *pvVar12;
  FILE *__stream;
  TString *pTVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  uint full;
  uint uVar20;
  char *pcVar21;
  Proto *pPVar22;
  char *pcVar23;
  char *pcVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  char *pcVar28;
  uint uVar29;
  uint local_3c;
  lua_Integer local_38;
  
  lVar11 = lua_tointegerx(L,1,(int *)0x0);
  pvVar12 = lua_touserdata(L,2);
  uVar25 = (uint)lVar11;
  full = uVar25;
  iVar7 = lua_checkstack(L,uVar25);
  if (iVar7 == 0) {
LAB_001049f2:
    pmain_cold_3();
LAB_001049f7:
    pmain_cold_2();
LAB_001049ff:
    cannot("open");
  }
  else {
    local_38 = lVar11;
    if (0 < (int)uVar25) {
      uVar16 = 0;
      do {
        pcVar28 = *(char **)((long)pvVar12 + uVar16 * 8);
        iVar7 = strcmp(pcVar28,"-");
        if (iVar7 == 0) {
          pcVar28 = (char *)0x0;
        }
        iVar7 = luaL_loadfilex(L,pcVar28,(char *)0x0);
        full = (uint)pcVar28;
        if (iVar7 != 0) {
          pmain_cold_1();
          goto LAB_001049f2;
        }
        uVar16 = uVar16 + 1;
      } while ((uVar25 & 0x7fffffff) != uVar16);
    }
    uVar25 = (uint)local_38;
    if (uVar25 == 1) {
      pPVar22 = *(Proto **)(L->top[-1].value_.f + 0x18);
    }
    else {
      full = 0x1051d4;
      uVar16 = 0;
      local_3c = uVar25;
      iVar7 = lua_load(L,reader,&local_3c,"=(luac)",(char *)0x0);
      if (iVar7 != 0) goto LAB_001049f7;
      pPVar22 = *(Proto **)(L->top[-1].value_.f + 0x18);
      if (0 < (int)uVar25) {
        lVar27 = (long)(int)~uVar25 << 4;
        uVar16 = 0;
        do {
          pPVar22->p[uVar16] = *(Proto **)(*(long *)((long)&L->top->value_ + lVar27) + 0x18);
          if (0 < pPVar22->p[uVar16]->sizeupvalues) {
            pPVar22->p[uVar16]->upvalues->instack = '\0';
          }
          uVar16 = uVar16 + 1;
          lVar27 = lVar27 + 0x10;
        } while ((uVar25 & 0x7fffffff) != uVar16);
      }
      local_3c = (uint)uVar16;
      pPVar22->sizelineinfo = 0;
    }
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(pPVar22,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x118313;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_001049ff;
    luaU_dump(L,pPVar22,writer,__stream,(uint)stripping);
    full = (uint)pPVar22;
    iVar7 = ferror(__stream);
    if (iVar7 == 0) {
      iVar7 = fclose(__stream);
      if (iVar7 == 0) {
        return 0;
      }
      goto LAB_00104a17;
    }
  }
  cannot("write");
LAB_00104a17:
  pcVar28 = "close";
  cannot("close");
  pTVar13 = (TString *)"=?";
  if (((Proto *)pcVar28)->source != (TString *)0x0) {
    pTVar13 = ((Proto *)pcVar28)->source + 1;
  }
  cVar1 = *(char *)&pTVar13->next;
  if (cVar1 == '\x1b') {
    pcVar14 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar14 = (char *)((long)&pTVar13->next + 1);
  }
  else {
    pcVar14 = "(string)";
  }
  uVar25 = ((Proto *)pcVar28)->sizep;
  pcVar21 = "function";
  if (((Proto *)pcVar28)->linedefined == 0) {
    pcVar21 = "main";
  }
  pcVar17 = "s";
  pcVar23 = "s";
  if (((Proto *)pcVar28)->sizecode == 1) {
    pcVar23 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar21,pcVar14,
         (ulong)(uint)((Proto *)pcVar28)->linedefined,
         (ulong)(uint)((Proto *)pcVar28)->lastlinedefined,(ulong)(uint)((Proto *)pcVar28)->sizecode,
         pcVar23,pcVar28);
  pcVar14 = "+";
  if (((Proto *)pcVar28)->is_vararg == '\0') {
    pcVar14 = "";
  }
  pcVar21 = "s";
  if (((Proto *)pcVar28)->numparams == 1) {
    pcVar21 = "";
  }
  pcVar23 = "s";
  if (((Proto *)pcVar28)->maxstacksize == 1) {
    pcVar23 = "";
  }
  pcVar24 = "s";
  if (((Proto *)pcVar28)->sizeupvalues == 1) {
    pcVar24 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)((Proto *)pcVar28)->numparams,pcVar14,
         pcVar21,(ulong)((Proto *)pcVar28)->maxstacksize,pcVar23,
         (ulong)(uint)((Proto *)pcVar28)->sizeupvalues,pcVar24);
  pcVar14 = "s";
  if (((Proto *)pcVar28)->sizelocvars == 1) {
    pcVar14 = "";
  }
  pcVar21 = "s";
  if (((Proto *)pcVar28)->sizek == 1) {
    pcVar21 = "";
  }
  if (((Proto *)pcVar28)->sizep == 1) {
    pcVar17 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)((Proto *)pcVar28)->sizelocvars,
         pcVar14,(ulong)(uint)((Proto *)pcVar28)->sizek,pcVar21,
         (ulong)(uint)((Proto *)pcVar28)->sizep,pcVar17,pcVar24);
  iVar7 = ((Proto *)pcVar28)->sizecode;
  iVar10 = iVar7;
  if (0 < iVar7) {
    pIVar3 = ((Proto *)pcVar28)->code;
    uVar15 = 0;
    do {
      if (((Proto *)pcVar28)->lineinfo == (int *)0x0) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = ((Proto *)pcVar28)->lineinfo[(int)uVar15];
      }
      uVar19 = pIVar3[(int)uVar15];
      uVar18 = uVar15 + 1;
      printf("\t%d\t",(ulong)uVar18);
      if ((int)uVar9 < 1) {
        printf("[-]\t");
      }
      else {
        printf("[%d]\t",(ulong)uVar9);
      }
      uVar26 = uVar19 & 0x3f;
      uVar29 = uVar19 >> 6;
      uVar16 = (ulong)uVar29 & 0xff;
      uVar8 = uVar19 >> 0x17;
      uVar9 = uVar19 >> 0xe;
      printf("%-9s\t",luaP_opnames[uVar26]);
      bVar2 = luaP_opmodes[uVar26];
      switch(bVar2 & 3) {
      case 0:
        printf("%d",uVar16);
        if ((bVar2 & 0x30) != 0) {
          uVar20 = ~uVar8 | 0xffffff00;
          if (-1 < (int)uVar19) {
            uVar20 = uVar8;
          }
          printf(" %d",(ulong)uVar20);
        }
        if ((bVar2 & 0xc) != 0) {
          uVar20 = ~uVar9 | 0xffffff00;
          if ((uVar19 >> 0x16 & 1) == 0) {
            uVar20 = uVar9 & 0x1ff;
          }
LAB_00104d19:
          pcVar14 = " %d";
          goto LAB_00104d20;
        }
        break;
      case 1:
        printf("%d",uVar16);
        if ((bVar2 & 0x30) == 0x10) {
          printf(" %d",(ulong)uVar9);
        }
        else if ((bVar2 & 0x30) == 0x30) {
          uVar20 = ~uVar9;
          goto LAB_00104d19;
        }
        break;
      case 2:
        printf("%d %d",uVar16,(ulong)(uVar9 - 0x1ffff));
        break;
      case 3:
        uVar20 = ~uVar29;
        pcVar14 = "%d";
LAB_00104d20:
        printf(pcVar14,(ulong)uVar20);
      }
      switch(uVar26) {
      case 1:
        printf("\t; ");
        goto LAB_00104eca;
      default:
        break;
      case 5:
      case 9:
        lVar27 = *(long *)((long)&((Proto *)pcVar28)->upvalues->name + (ulong)(uVar8 << 4));
        pPVar22 = (Proto *)0x118139;
        if (lVar27 != 0) {
          pPVar22 = (Proto *)(lVar27 + 0x18);
        }
        pcVar14 = "\t; %s";
        goto LAB_00104e6a;
      case 6:
        lVar27 = *(long *)((long)&((Proto *)pcVar28)->upvalues->name + (ulong)(uVar8 << 4));
        pcVar14 = "-";
        if (lVar27 != 0) {
          pcVar14 = (char *)(lVar27 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((uVar19 >> 0x16 & 1) != 0) {
          putchar(0x20);
          PrintConstant((Proto *)pcVar28,uVar9 & 0xff);
        }
        break;
      case 7:
      case 0xc:
        if ((uVar19 >> 0x16 & 1) != 0) {
          printf("\t; ");
          uVar9 = uVar9 & 0xff;
          goto LAB_00104eca;
        }
        break;
      case 8:
        lVar27 = *(long *)((long)&((Proto *)pcVar28)->upvalues->name +
                          (ulong)(uint)((int)uVar16 << 4));
        pcVar14 = "-";
        if (lVar27 != 0) {
          pcVar14 = (char *)(lVar27 + 0x18);
        }
        printf("\t; %s",pcVar14);
        if ((int)uVar19 < 0) {
          putchar(0x20);
          PrintConstant((Proto *)pcVar28,uVar8 & 0xff);
        }
        if ((uVar19 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104f41:
          PrintConstant((Proto *)pcVar28,uVar9 & 0xff);
        }
        break;
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x1f:
      case 0x20:
      case 0x21:
        if ((uVar19 & 0x80400000) != 0) {
          printf("\t; ");
          if ((int)uVar19 < 0) {
            PrintConstant((Proto *)pcVar28,uVar8 & 0xff);
          }
          else {
            putchar(0x2d);
          }
          putchar(0x20);
          if ((uVar19 >> 0x16 & 1) != 0) goto LAB_00104f41;
          putchar(0x2d);
        }
        break;
      case 0x1e:
      case 0x27:
      case 0x28:
      case 0x2a:
        printf("\t; to %d",(ulong)(uVar15 + (uVar9 - 0x1ffff) + 2));
        break;
      case 0x2b:
        if ((uVar9 & 0x1ff) == 0) {
          printf("\t; %d",(ulong)pIVar3[(int)uVar18]);
          uVar15 = uVar18;
        }
        else {
          printf("\t; %d");
        }
        break;
      case 0x2c:
        pPVar22 = ((Proto *)pcVar28)->p[uVar9];
        pcVar14 = "\t; %p";
LAB_00104e6a:
        printf(pcVar14,pPVar22);
        break;
      case 0x2e:
        printf("\t; ");
        uVar9 = uVar29;
LAB_00104eca:
        PrintConstant((Proto *)pcVar28,uVar9);
      }
      iVar10 = putchar(10);
      uVar15 = uVar15 + 1;
    } while ((int)uVar15 < iVar7);
  }
  if (full != 0) {
    uVar15 = ((Proto *)pcVar28)->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar15,pcVar28);
    if (0 < (int)uVar15) {
      uVar9 = 0;
      do {
        uVar19 = uVar9 + 1;
        printf("\t%d\t",(ulong)uVar19);
        PrintConstant((Proto *)pcVar28,uVar9);
        putchar(10);
        uVar9 = uVar19;
      } while (uVar15 != uVar19);
    }
    uVar15 = ((Proto *)pcVar28)->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar15,pcVar28);
    if (0 < (long)(int)uVar15) {
      lVar27 = 0xc;
      uVar16 = 0;
      do {
        pLVar4 = ((Proto *)pcVar28)->locvars;
        printf("\t%d\t%s\t%d\t%d\n",uVar16 & 0xffffffff,
               *(long *)((long)pLVar4 + lVar27 + -0xc) + 0x18,
               (ulong)(*(int *)((long)pLVar4 + lVar27 + -4) + 1),
               (ulong)(*(int *)((long)&pLVar4->varname + lVar27) + 1));
        uVar16 = uVar16 + 1;
        lVar27 = lVar27 + 0x10;
      } while ((long)(int)uVar15 != uVar16);
    }
    uVar15 = ((Proto *)pcVar28)->sizeupvalues;
    iVar10 = printf("upvalues (%d) for %p:\n",(ulong)uVar15,pcVar28);
    if (0 < (long)(int)uVar15) {
      lVar27 = 9;
      uVar16 = 0;
      do {
        pUVar5 = ((Proto *)pcVar28)->upvalues;
        lVar6 = *(long *)((long)pUVar5 + lVar27 + -9);
        pcVar14 = (char *)(lVar6 + 0x18);
        if (lVar6 == 0) {
          pcVar14 = "-";
        }
        iVar10 = printf("\t%d\t%s\t%d\t%d\n",uVar16 & 0xffffffff,pcVar14,
                        (ulong)*(byte *)((long)pUVar5 + lVar27 + -1),
                        (ulong)*(byte *)((long)&pUVar5->name + lVar27));
        uVar16 = uVar16 + 1;
        lVar27 = lVar27 + 0x10;
      } while ((long)(int)uVar15 != uVar16);
    }
  }
  if (0 < (int)uVar25) {
    uVar16 = 0;
    do {
      PrintFunction(((Proto *)pcVar28)->p[uVar16],full);
      uVar16 = uVar16 + 1;
      iVar10 = extraout_EAX;
    } while (uVar25 != uVar16);
  }
  return iVar10;
}

Assistant:

static int pmain(lua_State *L) {
    int argc = (int) lua_tointeger(L, 1);
    char **argv = (char **) lua_touserdata(L, 2);
    const Proto *f;
    int i;
    if (!lua_checkstack(L, argc)) fatal("too many input files");
    for (i = 0; i < argc; i++) {
        const char *filename = IS("-") ? NULL : argv[i];
        if (luaL_loadfile(L, filename) != LUA_OK) fatal(lua_tostring(L, -1));
    }
    f = combine(L, argc);
    if (listing) luaU_print(f, listing > 1);
    if (dumping) {
        FILE *D = (output == NULL) ? stdout : fopen(output, "wb");
        if (D == NULL) cannot("open");
        lua_lock(L);
        luaU_dump(L, f, writer, D, stripping);
        lua_unlock(L);
        if (ferror(D)) cannot("write");
        if (fclose(D)) cannot("close");
    }
    return 0;
}